

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O1

void __thiscall google::protobuf::SingleArena_GetSet_Test::TestBody(SingleArena_GetSet_Test *this)

{
  char *pcVar1;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  AssertionResult gtest_ar;
  ArenaStringPtr field;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  ArenaStringPtr local_18;
  _Head_base<0UL,_google::protobuf::Arena_*,_false> local_10;
  
  SingleArena::GetArena((SingleArena *)&stack0xfffffffffffffff0);
  local_18.tagged_ptr_.ptr_ = (TaggedStringPtr)&protobuf::internal::fixed_address_empty_string;
  pcVar1 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_28,"\"\"","field.Get()",(char (*) [1])(anon_var_dwarf_a12c75 + 5),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x38,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  value._M_str = "Test short";
  value._M_len = 10;
  protobuf::internal::ArenaStringPtr::Set(&local_18,value,local_10._M_head_impl);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_28,"\"Test short\"","field.Get()",(char (*) [11])"Test short",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_18.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x3a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  value_00._M_str = "Test long long long long value";
  value_00._M_len = 0x1e;
  protobuf::internal::ArenaStringPtr::Set(&local_18,value_00,local_10._M_head_impl);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            (local_28,"\"Test long long long long value\"","field.Get()",
             (char (*) [31])"Test long long long long value",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_18.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  protobuf::internal::ArenaStringPtr::Set
            (&local_18,(string_view)(ZEXT816(0x1141ae9) << 0x40),local_10._M_head_impl);
  protobuf::internal::ArenaStringPtr::Destroy(&local_18);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              &stack0xfffffffffffffff0);
  return;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}